

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

void __thiscall
slang::ast::SampledValueExprVisitor::visit<slang::ast::NewArrayExpression>
          (SampledValueExprVisitor *this,NewArrayExpression *expr)

{
  ExpressionKind EVar1;
  bool bVar2;
  KnownSystemName name;
  Symbol *pSVar3;
  SourceLocation SVar4;
  SourceLocation SVar5;
  CallExpression *call;
  DiagCode code;
  ASTContext *this_00;
  SourceRange sourceRange;
  
  EVar1 = (expr->super_Expression).kind;
  if (EVar1 == Call) {
    if (*(char *)&expr[1].super_Expression.sourceRange.startLoc == '\x01') {
      name = CallExpression::getKnownSystemName((CallExpression *)expr);
      if ((name == Matched) && (expr[1].initializer_ != (Expression *)0x0)) {
        bVar2 = Type::isSequenceType(*(Type **)(*(long *)expr[1].sizeExpr_ + 8));
        if (bVar2) {
          ASTContext::addDiag(this->context,this->matchedCode,(expr->super_Expression).sourceRange);
        }
      }
      if (this->isFutureGlobal == true) {
        bVar2 = SemanticFacts::isGlobalFutureSampledValueFunc(name);
        if (bVar2) {
          this_00 = this->context;
          SVar5 = (expr->super_Expression).sourceRange.startLoc;
          SVar4 = (expr->super_Expression).sourceRange.endLoc;
          code.subsystem = Statements;
          code.code = 0x1d;
          goto LAB_003bc234;
        }
      }
    }
  }
  else {
    if (EVar1 != NamedValue) {
      NewArrayExpression::visitExprs<slang::ast::SampledValueExprVisitor&>(expr,this);
      return;
    }
    pSVar3 = Expression::getSymbolReference(&expr->super_Expression,true);
    if ((pSVar3 != (Symbol *)0x0) &&
       ((pSVar3->kind == LocalAssertionVar ||
        ((pSVar3->kind == AssertionPort && (*(char *)((long)&pSVar3[2].name._M_len + 4) == '\x01')))
        ))) {
      this_00 = this->context;
      code = this->localVarCode;
      SVar5 = (expr->super_Expression).sourceRange.startLoc;
      SVar4 = (expr->super_Expression).sourceRange.endLoc;
LAB_003bc234:
      sourceRange.endLoc = SVar4;
      sourceRange.startLoc = SVar5;
      ASTContext::addDiag(this_00,code,sourceRange);
      return;
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                    if (auto sym = expr.getSymbolReference()) {
                        if (sym->kind == SymbolKind::LocalAssertionVar ||
                            (sym->kind == SymbolKind::AssertionPort &&
                             sym->template as<AssertionPortSymbol>().isLocalVar())) {
                            context.addDiag(localVarCode, expr.sourceRange);
                        }
                    }
                    break;
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.isSystemCall()) {
                        auto ksn = call.getKnownSystemName();
                        if (ksn == KnownSystemName::Matched && !call.arguments().empty() &&
                            call.arguments()[0]->type->isSequenceType()) {
                            context.addDiag(matchedCode, expr.sourceRange);
                        }

                        if (isFutureGlobal && SemanticFacts::isGlobalFutureSampledValueFunc(ksn))
                            context.addDiag(diag::GlobalSampledValueNested, expr.sourceRange);
                    }
                    break;
                }
                default:
                    if constexpr (HasVisitExprs<T, SampledValueExprVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }